

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocket_test.cpp
# Opt level: O0

pboolean compare_socket_addresses(PSocketAddress *addr1,PSocketAddress *addr2)

{
  int iVar1;
  int iVar2;
  char *__s1;
  char *__s2;
  long lVar3;
  long lVar4;
  pboolean addr_cmp;
  pchar *addr_str2;
  pchar *addr_str1;
  PSocketAddress *addr2_local;
  PSocketAddress *addr1_local;
  
  if ((addr1 == (PSocketAddress *)0x0) || (addr2 == (PSocketAddress *)0x0)) {
    addr1_local._4_4_ = 0;
  }
  else {
    __s1 = (char *)p_socket_address_get_address(addr1);
    __s2 = (char *)p_socket_address_get_address(addr2);
    if ((__s1 == (char *)0x0) || (__s2 == (char *)0x0)) {
      p_free(__s1);
      p_free(__s2);
      addr1_local._4_4_ = 0;
    }
    else {
      iVar1 = strcmp(__s1,__s2);
      p_free(__s1);
      p_free(__s2);
      if (iVar1 == 0) {
        iVar1 = p_socket_address_get_family(addr1);
        iVar2 = p_socket_address_get_family(addr2);
        if (iVar1 == iVar2) {
          lVar3 = p_socket_address_get_native_size(addr1);
          lVar4 = p_socket_address_get_native_size(addr2);
          if (lVar3 == lVar4) {
            addr1_local._4_4_ = 1;
          }
          else {
            addr1_local._4_4_ = 0;
          }
        }
        else {
          addr1_local._4_4_ = 0;
        }
      }
      else {
        addr1_local._4_4_ = 0;
      }
    }
  }
  return addr1_local._4_4_;
}

Assistant:

static pboolean compare_socket_addresses (const PSocketAddress *addr1, const PSocketAddress *addr2)
{
	if (addr1 == NULL || addr2 == NULL)
		return FALSE;

	pchar *addr_str1 = p_socket_address_get_address (addr1);
	pchar *addr_str2 = p_socket_address_get_address (addr2);

	if (addr_str1 == NULL || addr_str2 == NULL) {
		p_free (addr_str1);
		p_free (addr_str2);

		return FALSE;
	}

	pboolean addr_cmp = (strcmp (addr_str1, addr_str2) == 0 ? TRUE : FALSE);

	p_free (addr_str1);
	p_free (addr_str2);

	if (addr_cmp == FALSE)
		return FALSE;

	if (p_socket_address_get_family (addr1) != p_socket_address_get_family (addr2))
		return FALSE;

	if (p_socket_address_get_native_size (addr1) != p_socket_address_get_native_size (addr2))
		return FALSE;

	return TRUE;
}